

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

BrOn * __thiscall
wasm::Builder::makeBrOn(Builder *this,BrOnOp op,Name name,Expression *ref,Type castType)

{
  BrOn *pBVar1;
  
  pBVar1 = MixedArena::alloc<wasm::BrOn>(&this->wasm->allocator);
  pBVar1->op = op;
  (pBVar1->name).super_IString.str._M_len = name.super_IString.str._M_len;
  (pBVar1->name).super_IString.str._M_str = name.super_IString.str._M_str;
  pBVar1->ref = ref;
  (pBVar1->castType).id = castType.id;
  wasm::BrOn::finalize();
  return pBVar1;
}

Assistant:

BrOn*
  makeBrOn(BrOnOp op, Name name, Expression* ref, Type castType = Type::none) {
    auto* ret = wasm.allocator.alloc<BrOn>();
    ret->op = op;
    ret->name = name;
    ret->ref = ref;
    ret->castType = castType;
    ret->finalize();
    return ret;
  }